

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O2

void avro::
     codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>_>
     ::decode(Decoder *d,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
             *s)

{
  long lVar1;
  mapped_type *this;
  bool bVar2;
  string k;
  Nested t;
  string local_80;
  Nested local_60;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
  ::clear(&s->_M_t);
  lVar1 = (**(code **)(*(long *)d + 0x98))(d);
  while (lVar1 != 0) {
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::decode(d,&local_80);
      local_60.inval2._M_string_length = 0;
      local_60.inval2.field_2._M_local_buf[0] = '\0';
      local_60.inval1 = 0.0;
      local_60.inval3 = 0;
      local_60.inval2._M_dataplus._M_p = (pointer)&local_60.inval2.field_2;
      codec_traits<testgen_r::Nested>::decode(d,&local_60);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
             ::operator[](s,&local_80);
      testgen_r::Nested::operator=(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar1 = (**(code **)(*(long *)d + 0xa0))(d);
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::map<std::string, T>& s) {
        s.clear();
        for (size_t n = d.mapStart(); n != 0; n = d.mapNext()) {
            for (size_t i = 0; i < n; ++i) {
                std::string k;
                avro::decode(d, k);
                T t;
                avro::decode(d, t);
                s[k] = t;
            }
        }
    }